

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_auto_extension(_func_void *xInit)

{
  sqlite3_mutex *p;
  _func_void **pp_Var1;
  _func_void **aNew;
  u64 nByte;
  sqlite3_mutex *mutex;
  u32 i;
  int rc;
  _func_void *xInit_local;
  
  mutex._4_4_ = sqlite3_initialize();
  xInit_local._4_4_ = mutex._4_4_;
  if (mutex._4_4_ == 0) {
    p = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(p);
    for (mutex._0_4_ = 0;
        ((uint)mutex < sqlite3Autoext.nExt && (sqlite3Autoext.aExt[(uint)mutex] != xInit));
        mutex._0_4_ = (uint)mutex + 1) {
    }
    if ((uint)mutex == sqlite3Autoext.nExt) {
      pp_Var1 = (_func_void **)
                sqlite3_realloc64(sqlite3Autoext.aExt,(ulong)(sqlite3Autoext.nExt + 1) << 3);
      if (pp_Var1 == (_func_void **)0x0) {
        mutex._4_4_ = 7;
      }
      else {
        sqlite3Autoext.aExt = pp_Var1;
        pp_Var1[sqlite3Autoext.nExt] = xInit;
        sqlite3Autoext.nExt = sqlite3Autoext.nExt + 1;
      }
    }
    sqlite3_mutex_leave(p);
    xInit_local._4_4_ = mutex._4_4_;
  }
  return xInit_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_auto_extension(
  void (*xInit)(void)
){
  int rc = SQLITE_OK;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ){
    return rc;
  }else
#endif
  {
    u32 i;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    for(i=0; i<wsdAutoext.nExt; i++){
      if( wsdAutoext.aExt[i]==xInit ) break;
    }
    if( i==wsdAutoext.nExt ){
      u64 nByte = (wsdAutoext.nExt+1)*sizeof(wsdAutoext.aExt[0]);
      void (**aNew)(void);
      aNew = sqlite3_realloc64(wsdAutoext.aExt, nByte);
      if( aNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        wsdAutoext.aExt = aNew;
        wsdAutoext.aExt[wsdAutoext.nExt] = xInit;
        wsdAutoext.nExt++;
      }
    }
    sqlite3_mutex_leave(mutex);
    assert( (rc&0xff)==rc );
    return rc;
  }
}